

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  size_t sVar1;
  Ref<embree::Geometry> *pRVar2;
  Geometry *pGVar3;
  RTCIntersectArguments *k;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  vbool<4> vVar13;
  uint uVar14;
  int iVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  ulong uVar17;
  RTCRayN *pRVar18;
  uint uVar19;
  undefined4 uVar20;
  uint uVar21;
  RTCIntersectArguments *pRVar22;
  NodeRef root;
  long lVar23;
  size_t sVar24;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar25;
  ulong uVar26;
  NodeRef *pNVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar41;
  float fVar43;
  vint4 ai;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  float fVar44;
  float fVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar59;
  float fVar60;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar55;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar64;
  float fVar68;
  float fVar69;
  undefined1 auVar65 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar66;
  float fVar70;
  undefined1 auVar67 [16];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar76;
  float fVar79;
  vint4 ai_1;
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar75;
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  vint4 ai_3;
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  vint4 bi;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar114;
  float fVar115;
  vint4 bi_3;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar116;
  undefined1 auVar113 [16];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  vint4 bi_1;
  float fVar123;
  uint uVar124;
  float fVar125;
  uint uVar126;
  uint uVar127;
  float fVar128;
  uint uVar129;
  uint uVar130;
  float fVar131;
  vint4 ai_2;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  float fVar135;
  uint uVar136;
  uint uVar137;
  vint4 bi_2;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint uVar141;
  uint uVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  Precalculations pre;
  undefined1 local_1998 [8];
  undefined8 uStack_1990;
  float local_1988;
  float fStack_1984;
  float fStack_1980;
  float fStack_197c;
  undefined8 local_1968;
  undefined8 uStack_1960;
  float local_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  uint local_1908;
  uint uStack_1904;
  uint uStack_1900;
  uint uStack_18fc;
  vbool<4> terminated;
  undefined1 local_18b8 [16];
  BVH *local_18a8;
  Intersectors *local_18a0;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_false> tray;
  uint local_1778;
  uint uStack_1774;
  uint uStack_1770;
  uint uStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  uint local_1708;
  uint uStack_1704;
  uint uStack_1700;
  uint uStack_16fc;
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar12 = mm_lookupmask_ps._8_8_;
  uVar11 = mm_lookupmask_ps._0_8_;
  local_18a8 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_18a8->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar67._8_4_ = 0xffffffff;
    auVar67._0_8_ = 0xffffffffffffffff;
    auVar67._12_4_ = 0xffffffff;
    auVar65 = *(undefined1 (*) [16])(ray + 0x80);
    auVar74._0_12_ = ZEXT812(0);
    auVar74._12_4_ = 0;
    uVar139 = -(uint)(0.0 <= auVar65._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar140 = -(uint)(0.0 <= auVar65._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar141 = -(uint)(0.0 <= auVar65._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar142 = -(uint)(0.0 <= auVar65._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar32._4_4_ = uVar140;
    auVar32._0_4_ = uVar139;
    auVar32._8_4_ = uVar141;
    auVar32._12_4_ = uVar142;
    uVar19 = movmskps((int)context,auVar32);
    pRVar22 = (RTCIntersectArguments *)(ulong)uVar19;
    if (uVar19 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x40))->v;
      tray.dir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x50))->v;
      tray.dir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)
           *(undefined1 (*) [16])((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(ray + 0x60))->v;
      fVar94 = (float)DAT_01f80d30;
      fVar98 = DAT_01f80d30._4_4_;
      fVar102 = DAT_01f80d30._8_4_;
      fVar106 = DAT_01f80d30._12_4_;
      auVar47._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar98);
      auVar47._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar94);
      auVar47._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar102);
      auVar47._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar106);
      auVar111 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f80d30,auVar47
                         );
      auVar87._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar98);
      auVar87._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar94);
      auVar87._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar102);
      auVar87._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar106);
      auVar47 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f80d30,auVar87)
      ;
      auVar31._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar98);
      auVar31._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar94);
      auVar31._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar102);
      auVar31._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar106);
      auVar87 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f80d30,auVar31)
      ;
      auVar32 = rcpps(auVar31,auVar111);
      fVar30 = auVar32._0_4_;
      auVar112._0_4_ = auVar111._0_4_ * fVar30;
      fVar42 = auVar32._4_4_;
      auVar112._4_4_ = auVar111._4_4_ * fVar42;
      fVar44 = auVar32._8_4_;
      auVar112._8_4_ = auVar111._8_4_ * fVar44;
      fVar46 = auVar32._12_4_;
      auVar112._12_4_ = auVar111._12_4_ * fVar46;
      fVar94 = 1.0;
      fVar98 = 1.0;
      fVar102 = 1.0;
      fVar106 = 1.0;
      tray.rdir.field_0._0_4_ = (1.0 - auVar112._0_4_) * fVar30 + fVar30;
      tray.rdir.field_0._4_4_ = (1.0 - auVar112._4_4_) * fVar42 + fVar42;
      tray.rdir.field_0._8_4_ = (1.0 - auVar112._8_4_) * fVar44 + fVar44;
      tray.rdir.field_0._12_4_ = (1.0 - auVar112._12_4_) * fVar46 + fVar46;
      auVar32 = rcpps(auVar112,auVar47);
      fVar30 = auVar32._0_4_;
      fVar42 = auVar32._4_4_;
      fVar44 = auVar32._8_4_;
      fVar46 = auVar32._12_4_;
      tray.rdir.field_0._16_4_ = (1.0 - auVar47._0_4_ * fVar30) * fVar30 + fVar30;
      tray.rdir.field_0._20_4_ = (1.0 - auVar47._4_4_ * fVar42) * fVar42 + fVar42;
      tray.rdir.field_0._24_4_ = (1.0 - auVar47._8_4_ * fVar44) * fVar44 + fVar44;
      tray.rdir.field_0._28_4_ = (1.0 - auVar47._12_4_ * fVar46) * fVar46 + fVar46;
      auVar47 = rcpps(auVar32,auVar87);
      fVar30 = auVar47._0_4_;
      fVar42 = auVar47._4_4_;
      fVar44 = auVar47._8_4_;
      fVar46 = auVar47._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar87._0_4_ * fVar30) * fVar30 + fVar30;
      tray.rdir.field_0._36_4_ = (1.0 - auVar87._4_4_ * fVar42) * fVar42 + fVar42;
      tray.rdir.field_0._40_4_ = (1.0 - auVar87._8_4_ * fVar44) * fVar44 + fVar44;
      tray.rdir.field_0._44_4_ = (1.0 - auVar87._12_4_ * fVar46) * fVar46 + fVar46;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar111._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar111._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar111._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar111._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar111);
      auVar33._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar33._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar33._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar33._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar33);
      auVar32 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar74);
      auVar34._4_4_ = uVar140;
      auVar34._0_4_ = uVar139;
      auVar34._8_4_ = uVar141;
      auVar34._12_4_ = uVar142;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar32,auVar34);
      auVar65 = maxps(auVar65,auVar74);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar65,auVar34);
      auVar65._4_4_ = uVar140;
      auVar65._0_4_ = uVar139;
      auVar65._8_4_ = uVar141;
      auVar65._12_4_ = uVar142;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar67 ^ auVar65);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar19 = 3;
      }
      else {
        pRVar22 = (RTCIntersectArguments *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        uVar19 = ((char)pRVar22 == '\0') + 2;
      }
      pNVar27 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar25 = &stack_near[2].field_0;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0._8_8_ = 0x7f8000007f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar14 = 0x21d2f80;
      local_18a0 = This;
      fVar46 = (float)tray.nearXYZ.field_0._12_4_;
      fVar44 = (float)tray.nearXYZ.field_0._8_4_;
      fVar42 = (float)tray.nearXYZ.field_0._4_4_;
      fVar30 = (float)tray.nearXYZ.field_0._0_4_;
      aVar75 = tray.tfar.field_0;
LAB_00db90ff:
      do {
        do {
          root.ptr = pNVar27[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00db9ed0;
          pNVar27 = pNVar27 + -1;
          paVar25 = paVar25 + -1;
          aVar55.v = *(__m128 *)paVar25->v;
          auVar35._4_4_ = -(uint)(aVar55.v[1] < tray.tfar.field_0.v[1]);
          auVar35._0_4_ = -(uint)(aVar55.v[0] < tray.tfar.field_0.v[0]);
          auVar35._8_4_ = -(uint)(aVar55.v[2] < tray.tfar.field_0.v[2]);
          auVar35._12_4_ = -(uint)(aVar55._12_4_ < tray.tfar.field_0.v[3]);
          uVar14 = movmskps(uVar14,auVar35);
        } while (uVar14 == 0);
        uVar16 = (ulong)(byte)uVar14;
        uVar21 = uVar14 & 0xff;
        if (uVar19 < (uint)POPCOUNT(uVar21)) {
LAB_00db913f:
          do {
            vVar13.field_0 = terminated.field_0;
            uVar21 = (uint)root.ptr;
            fVar54 = aVar55.v[0];
            fVar59 = aVar55.v[1];
            fVar61 = aVar55.v[2];
            fVar63 = aVar55.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00db9ed0;
              auVar38._4_4_ = -(uint)(fVar59 < tray.tfar.field_0.v[1]);
              auVar38._0_4_ = -(uint)(fVar54 < tray.tfar.field_0.v[0]);
              auVar38._8_4_ = -(uint)(fVar61 < tray.tfar.field_0.v[2]);
              auVar38._12_4_ = -(uint)(fVar63 < tray.tfar.field_0.v[3]);
              iVar15 = movmskps(uVar14,auVar38);
              if (iVar15 == 0) {
                uVar14 = 0;
                goto LAB_00db90ff;
              }
              uVar16 = (ulong)(uVar21 & 0xf);
              if (uVar16 == 8) goto LAB_00db9e9f;
              auVar48._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              auVar48._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              auVar48._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar23 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              valid_i = (vint<4> *)0x0;
              goto LAB_00db9562;
            }
            uVar16 = root.ptr & 0xfffffffffffffff0;
            pRVar22 = (RTCIntersectArguments *)&DAT_fffffffffffffff0;
            sVar24 = 8;
            aVar55 = _DAT_01f7a9f0;
            do {
              sVar1 = *(size_t *)(uVar16 + 0x20 + (long)pRVar22 * 2);
              root.ptr = sVar24;
              if (sVar1 == 8) break;
              fVar45 = *(float *)((long)&pRVar22[4].filter + uVar16);
              fVar71 = *(float *)((long)&pRVar22[1].filter + uVar16);
              fVar107 = *(float *)((long)&pRVar22[2].flags + uVar16);
              fVar82 = *(float *)((long)&pRVar22[2].filter + uVar16);
              fVar110 = *(float *)((long)&pRVar22[3].flags + uVar16);
              fVar78 = *(float *)(ray + 0x70);
              fVar81 = *(float *)(ray + 0x74);
              fVar84 = *(float *)(ray + 0x78);
              fVar135 = *(float *)(ray + 0x7c);
              fVar85 = *(float *)((long)&pRVar22[5].filter + uVar16);
              fVar92 = *(float *)((long)&pRVar22[6].filter + uVar16);
              fVar95 = *(float *)((long)&pRVar22[3].filter + uVar16);
              fVar114 = *(float *)((long)&pRVar22[5].flags + uVar16);
              fVar115 = *(float *)((long)&pRVar22[6].flags + uVar16);
              fVar116 = *(float *)((long)&pRVar22[7].flags + uVar16);
              fVar73 = *(float *)((long)&pRVar22[4].flags + uVar16);
              fVar29 = ((fVar45 * fVar78 + fVar71) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar41 = ((fVar45 * fVar81 + fVar71) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar43 = ((fVar45 * fVar84 + fVar71) - (float)tray.org.field_0._8_4_) *
                       (float)tray.rdir.field_0._8_4_;
              fVar45 = ((fVar45 * fVar135 + fVar71) - (float)tray.org.field_0._12_4_) *
                       (float)tray.rdir.field_0._12_4_;
              fVar71 = ((fVar85 * fVar78 + fVar82) - (float)tray.org.field_0._16_4_) *
                       (float)tray.rdir.field_0._16_4_;
              fVar76 = ((fVar85 * fVar81 + fVar82) - (float)tray.org.field_0._20_4_) *
                       (float)tray.rdir.field_0._20_4_;
              fVar79 = ((fVar85 * fVar84 + fVar82) - (float)tray.org.field_0._24_4_) *
                       (float)tray.rdir.field_0._24_4_;
              fVar82 = ((fVar85 * fVar135 + fVar82) - (float)tray.org.field_0._28_4_) *
                       (float)tray.rdir.field_0._28_4_;
              fVar85 = ((fVar92 * fVar78 + fVar95) - (float)tray.org.field_0._32_4_) *
                       (float)tray.rdir.field_0._32_4_;
              fVar88 = ((fVar92 * fVar81 + fVar95) - (float)tray.org.field_0._36_4_) *
                       (float)tray.rdir.field_0._36_4_;
              fVar90 = ((fVar92 * fVar84 + fVar95) - (float)tray.org.field_0._40_4_) *
                       (float)tray.rdir.field_0._40_4_;
              fVar92 = ((fVar92 * fVar135 + fVar95) - (float)tray.org.field_0._44_4_) *
                       (float)tray.rdir.field_0._44_4_;
              fVar95 = ((fVar114 * fVar78 + fVar107) - (float)tray.org.field_0._0_4_) *
                       (float)tray.rdir.field_0._0_4_;
              fVar99 = ((fVar114 * fVar81 + fVar107) - (float)tray.org.field_0._4_4_) *
                       (float)tray.rdir.field_0._4_4_;
              fVar103 = ((fVar114 * fVar84 + fVar107) - (float)tray.org.field_0._8_4_) *
                        (float)tray.rdir.field_0._8_4_;
              fVar107 = ((fVar114 * fVar135 + fVar107) - (float)tray.org.field_0._12_4_) *
                        (float)tray.rdir.field_0._12_4_;
              fVar117 = ((fVar115 * fVar78 + fVar110) - (float)tray.org.field_0._16_4_) *
                        (float)tray.rdir.field_0._16_4_;
              fVar119 = ((fVar115 * fVar81 + fVar110) - (float)tray.org.field_0._20_4_) *
                        (float)tray.rdir.field_0._20_4_;
              fVar121 = ((fVar115 * fVar84 + fVar110) - (float)tray.org.field_0._24_4_) *
                        (float)tray.rdir.field_0._24_4_;
              fVar123 = ((fVar115 * fVar135 + fVar110) - (float)tray.org.field_0._28_4_) *
                        (float)tray.rdir.field_0._28_4_;
              fVar110 = ((fVar116 * fVar78 + fVar73) - (float)tray.org.field_0._32_4_) *
                        (float)tray.rdir.field_0._32_4_;
              fVar114 = ((fVar116 * fVar81 + fVar73) - (float)tray.org.field_0._36_4_) *
                        (float)tray.rdir.field_0._36_4_;
              fVar115 = ((fVar116 * fVar84 + fVar73) - (float)tray.org.field_0._40_4_) *
                        (float)tray.rdir.field_0._40_4_;
              fVar116 = ((fVar116 * fVar135 + fVar73) - (float)tray.org.field_0._44_4_) *
                        (float)tray.rdir.field_0._44_4_;
              uVar14 = (uint)((int)fVar95 < (int)fVar29) * (int)fVar95 |
                       (uint)((int)fVar95 >= (int)fVar29) * (int)fVar29;
              uVar126 = (uint)((int)fVar99 < (int)fVar41) * (int)fVar99 |
                        (uint)((int)fVar99 >= (int)fVar41) * (int)fVar41;
              uVar129 = (uint)((int)fVar103 < (int)fVar43) * (int)fVar103 |
                        (uint)((int)fVar103 >= (int)fVar43) * (int)fVar43;
              uVar132 = (uint)((int)fVar107 < (int)fVar45) * (int)fVar107 |
                        (uint)((int)fVar107 >= (int)fVar45) * (int)fVar45;
              uVar134 = (uint)((int)fVar117 < (int)fVar71) * (int)fVar117 |
                        (uint)((int)fVar117 >= (int)fVar71) * (int)fVar71;
              uVar136 = (uint)((int)fVar119 < (int)fVar76) * (int)fVar119 |
                        (uint)((int)fVar119 >= (int)fVar76) * (int)fVar76;
              uVar137 = (uint)((int)fVar121 < (int)fVar79) * (int)fVar121 |
                        (uint)((int)fVar121 >= (int)fVar79) * (int)fVar79;
              uVar138 = (uint)((int)fVar123 < (int)fVar82) * (int)fVar123 |
                        (uint)((int)fVar123 >= (int)fVar82) * (int)fVar82;
              uVar134 = ((int)uVar134 < (int)uVar14) * uVar14 |
                        ((int)uVar134 >= (int)uVar14) * uVar134;
              uVar136 = ((int)uVar136 < (int)uVar126) * uVar126 |
                        ((int)uVar136 >= (int)uVar126) * uVar136;
              uVar137 = ((int)uVar137 < (int)uVar129) * uVar129 |
                        ((int)uVar137 >= (int)uVar129) * uVar137;
              uVar138 = ((int)uVar138 < (int)uVar132) * uVar132 |
                        ((int)uVar138 >= (int)uVar132) * uVar138;
              uVar14 = (uint)((int)fVar110 < (int)fVar85) * (int)fVar110 |
                       (uint)((int)fVar110 >= (int)fVar85) * (int)fVar85;
              uVar126 = (uint)((int)fVar114 < (int)fVar88) * (int)fVar114 |
                        (uint)((int)fVar114 >= (int)fVar88) * (int)fVar88;
              uVar129 = (uint)((int)fVar115 < (int)fVar90) * (int)fVar115 |
                        (uint)((int)fVar115 >= (int)fVar90) * (int)fVar90;
              uVar132 = (uint)((int)fVar116 < (int)fVar92) * (int)fVar116 |
                        (uint)((int)fVar116 >= (int)fVar92) * (int)fVar92;
              uVar124 = ((int)uVar14 < (int)uVar134) * uVar134 |
                        ((int)uVar14 >= (int)uVar134) * uVar14;
              uVar127 = ((int)uVar126 < (int)uVar136) * uVar136 |
                        ((int)uVar126 >= (int)uVar136) * uVar126;
              uVar130 = ((int)uVar129 < (int)uVar137) * uVar137 |
                        ((int)uVar129 >= (int)uVar137) * uVar129;
              uVar133 = ((int)uVar132 < (int)uVar138) * uVar138 |
                        ((int)uVar132 >= (int)uVar138) * uVar132;
              uVar14 = (uint)((int)fVar95 < (int)fVar29) * (int)fVar29 |
                       (uint)((int)fVar95 >= (int)fVar29) * (int)fVar95;
              uVar126 = (uint)((int)fVar99 < (int)fVar41) * (int)fVar41 |
                        (uint)((int)fVar99 >= (int)fVar41) * (int)fVar99;
              uVar129 = (uint)((int)fVar103 < (int)fVar43) * (int)fVar43 |
                        (uint)((int)fVar103 >= (int)fVar43) * (int)fVar103;
              uVar132 = (uint)((int)fVar107 < (int)fVar45) * (int)fVar45 |
                        (uint)((int)fVar107 >= (int)fVar45) * (int)fVar107;
              uVar134 = (uint)((int)fVar117 < (int)fVar71) * (int)fVar71 |
                        (uint)((int)fVar117 >= (int)fVar71) * (int)fVar117;
              uVar136 = (uint)((int)fVar119 < (int)fVar76) * (int)fVar76 |
                        (uint)((int)fVar119 >= (int)fVar76) * (int)fVar119;
              uVar137 = (uint)((int)fVar121 < (int)fVar79) * (int)fVar79 |
                        (uint)((int)fVar121 >= (int)fVar79) * (int)fVar121;
              uVar138 = (uint)((int)fVar123 < (int)fVar82) * (int)fVar82 |
                        (uint)((int)fVar123 >= (int)fVar82) * (int)fVar123;
              uVar134 = ((int)uVar14 < (int)uVar134) * uVar14 |
                        ((int)uVar14 >= (int)uVar134) * uVar134;
              uVar136 = ((int)uVar126 < (int)uVar136) * uVar126 |
                        ((int)uVar126 >= (int)uVar136) * uVar136;
              uVar137 = ((int)uVar129 < (int)uVar137) * uVar129 |
                        ((int)uVar129 >= (int)uVar137) * uVar137;
              uVar138 = ((int)uVar132 < (int)uVar138) * uVar132 |
                        ((int)uVar132 >= (int)uVar138) * uVar138;
              uVar14 = (uint)((int)fVar110 < (int)fVar85) * (int)fVar85 |
                       (uint)((int)fVar110 >= (int)fVar85) * (int)fVar110;
              uVar126 = (uint)((int)fVar114 < (int)fVar88) * (int)fVar88 |
                        (uint)((int)fVar114 >= (int)fVar88) * (int)fVar114;
              uVar129 = (uint)((int)fVar115 < (int)fVar90) * (int)fVar90 |
                        (uint)((int)fVar115 >= (int)fVar90) * (int)fVar115;
              uVar132 = (uint)((int)fVar116 < (int)fVar92) * (int)fVar92 |
                        (uint)((int)fVar116 >= (int)fVar92) * (int)fVar116;
              uVar14 = ((int)uVar134 < (int)uVar14) * uVar134 |
                       ((int)uVar134 >= (int)uVar14) * uVar14;
              uVar126 = ((int)uVar136 < (int)uVar126) * uVar136 |
                        ((int)uVar136 >= (int)uVar126) * uVar126;
              uVar129 = ((int)uVar137 < (int)uVar129) * uVar137 |
                        ((int)uVar137 >= (int)uVar129) * uVar129;
              uVar132 = ((int)uVar138 < (int)uVar132) * uVar138 |
                        ((int)uVar138 >= (int)uVar132) * uVar132;
              bVar28 = (float)((tray.tnear.field_0.i[0] < (int)uVar124) * uVar124 |
                              (uint)(tray.tnear.field_0.i[0] >= (int)uVar124) *
                              tray.tnear.field_0.i[0]) <=
                       (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar14) * tray.tfar.field_0.i[0]
                              | (tray.tfar.field_0.i[0] >= (int)uVar14) * uVar14);
              bVar4 = (float)((tray.tnear.field_0.i[1] < (int)uVar127) * uVar127 |
                             (uint)(tray.tnear.field_0.i[1] >= (int)uVar127) *
                             tray.tnear.field_0.i[1]) <=
                      (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar126) * tray.tfar.field_0.i[1]
                             | (tray.tfar.field_0.i[1] >= (int)uVar126) * uVar126);
              bVar5 = (float)((tray.tnear.field_0.i[2] < (int)uVar130) * uVar130 |
                             (uint)(tray.tnear.field_0.i[2] >= (int)uVar130) *
                             tray.tnear.field_0.i[2]) <=
                      (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar129) * tray.tfar.field_0.i[2]
                             | (tray.tfar.field_0.i[2] >= (int)uVar129) * uVar129);
              bVar6 = (float)((tray.tnear.field_0.i[3] < (int)uVar133) * uVar133 |
                             (uint)(tray.tnear.field_0.i[3] >= (int)uVar133) *
                             tray.tnear.field_0.i[3]) <=
                      (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar132) * tray.tfar.field_0.i[3]
                             | (tray.tfar.field_0.i[3] >= (int)uVar132) * uVar132);
              if ((uVar21 & 7) == 6) {
                fVar45 = *(float *)((long)&pRVar22[7].filter + uVar16);
                fVar71 = *(float *)((long)&pRVar22[8].flags + uVar16);
                bVar28 = (fVar78 < fVar71 && fVar45 <= fVar78) && bVar28;
                bVar4 = (fVar81 < fVar71 && fVar45 <= fVar81) && bVar4;
                bVar5 = (fVar84 < fVar71 && fVar45 <= fVar84) && bVar5;
                bVar6 = (fVar135 < fVar71 && fVar45 <= fVar135) && bVar6;
              }
              auVar36._0_4_ = (-(uint)bVar28 & -(uint)(fVar54 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar36._4_4_ = (-(uint)bVar4 & -(uint)(fVar59 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar36._8_4_ = (-(uint)bVar5 & -(uint)(fVar61 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar36._12_4_ = (-(uint)bVar6 & -(uint)(fVar63 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar14 = movmskps((int)valid_i,auVar36);
              valid_i = (vint<4> *)(ulong)uVar14;
              aVar66 = aVar55;
              if ((uVar14 != 0) &&
                 (auVar7._4_4_ = uVar127, auVar7._0_4_ = uVar124, auVar7._8_4_ = uVar130,
                 auVar7._12_4_ = uVar133, aVar66.v = (__m128)blendvps(_DAT_01f7a9f0,auVar7,auVar36),
                 root.ptr = sVar1, sVar24 != 8)) {
                pNVar27->ptr = sVar24;
                pNVar27 = pNVar27 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar25->v = aVar55;
                paVar25 = paVar25 + 1;
              }
              aVar55 = aVar66;
              pRVar22 = (RTCIntersectArguments *)&pRVar22->feature_mask;
              sVar24 = root.ptr;
            } while (pRVar22 != (RTCIntersectArguments *)0x0);
            uVar14 = 4;
            if (root.ptr == 8) goto LAB_00db9429;
            auVar37._4_4_ = -(uint)(aVar55.v[1] < tray.tfar.field_0.v[1]);
            auVar37._0_4_ = -(uint)(aVar55.v[0] < tray.tfar.field_0.v[0]);
            auVar37._8_4_ = -(uint)(aVar55.v[2] < tray.tfar.field_0.v[2]);
            auVar37._12_4_ = -(uint)(aVar55.v[3] < tray.tfar.field_0.v[3]);
            uVar20 = movmskps((int)pRVar22,auVar37);
            pRVar22 = (RTCIntersectArguments *)(ulong)(uint)POPCOUNT(uVar20);
          } while ((byte)uVar19 < (byte)POPCOUNT(uVar20));
          pNVar27->ptr = root.ptr;
          pNVar27 = pNVar27 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar25->v = aVar55;
          paVar25 = paVar25 + 1;
        }
        else {
          do {
            k = (RTCIntersectArguments *)0x0;
            if (uVar16 != 0) {
              for (; (uVar16 >> (long)k & 1) == 0;
                  k = (RTCIntersectArguments *)((long)&k->flags + 1)) {
              }
            }
            pRVar22 = k;
            valid_i = (vint<4> *)local_18a0;
            bVar28 = occluded1(local_18a0,local_18a8,root,(size_t)k,&pre,ray,&tray,context);
            if (bVar28) {
              terminated.field_0.i[(long)k] = -1;
            }
            uVar26 = uVar16 - 1;
            uVar16 = uVar16 & uVar26;
          } while (uVar16 != 0);
          iVar15 = movmskps((int)uVar26,(undefined1  [16])terminated.field_0);
          if (iVar15 == 0xf) {
            uVar14 = 3;
          }
          else {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar14 = 2;
          }
          if (uVar19 < (uint)POPCOUNT(uVar21)) goto LAB_00db913f;
        }
LAB_00db9429:
      } while ((uVar14 == 4) || (uVar14 == 2));
LAB_00db9ed0:
      auVar40._4_4_ = uVar140 & terminated.field_0.i[1];
      auVar40._0_4_ = uVar139 & terminated.field_0.i[0];
      auVar40._8_4_ = uVar141 & terminated.field_0.i[2];
      auVar40._12_4_ = uVar142 & terminated.field_0.i[3];
      auVar65 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar40);
      *(undefined1 (*) [16])(ray + 0x80) = auVar65;
    }
  }
  return;
  while( true ) {
    valid_i = (vint<4> *)((long)&((Intersectors *)valid_i)->ptr + 1);
    lVar23 = lVar23 + 0x140;
    if ((Intersectors *)(uVar16 - 8) <= valid_i) break;
LAB_00db9562:
    fVar110 = aVar75.i[0];
    fVar85 = aVar75.i[1];
    fVar92 = aVar75.i[2];
    fVar95 = aVar75.i[3];
    uVar26 = 0;
    fVar54 = fVar30;
    fVar59 = fVar42;
    fVar61 = fVar44;
    fVar63 = fVar46;
    auVar65 = auVar48;
    fVar45 = fVar94;
    fVar71 = fVar98;
    fVar107 = fVar102;
    fVar82 = fVar106;
    while( true ) {
      uVar14 = *(uint *)(lVar23 + -0x10 + uVar26 * 4);
      if ((ulong)uVar14 == 0xffffffff) break;
      local_1968 = CONCAT44(local_1998._4_4_,local_1998._0_4_);
      uStack_1960._0_4_ = (float)uStack_1990;
      uStack_1960._4_4_ = uStack_1990._4_4_;
      fVar135 = *(float *)(ray + 0x50);
      fVar29 = *(float *)(ray + 0x54);
      fVar41 = *(float *)(ray + 0x58);
      fVar43 = *(float *)(ray + 0x5c);
      fVar76 = *(float *)(ray + 0x60);
      fVar79 = *(float *)(ray + 100);
      fVar88 = *(float *)(ray + 0x68);
      fVar90 = *(float *)(ray + 0x6c);
      fVar99 = *(float *)(ray + 0x70);
      fVar103 = *(float *)(ray + 0x74);
      fVar117 = *(float *)(ray + 0x78);
      fVar119 = *(float *)(ray + 0x7c);
      fVar94 = *(float *)(lVar23 + -0xa0 + uVar26 * 4);
      fVar98 = *(float *)(lVar23 + -0x90 + uVar26 * 4);
      fVar102 = *(float *)(lVar23 + -0x80 + uVar26 * 4);
      fVar114 = *(float *)(lVar23 + -0x130 + uVar26 * 4);
      fVar115 = *(float *)(lVar23 + -0x120 + uVar26 * 4);
      fVar116 = *(float *)(lVar23 + -0x110 + uVar26 * 4);
      fVar106 = *(float *)(lVar23 + -0x100 + uVar26 * 4);
      fVar143 = fVar94 * fVar99 + fVar114;
      fVar144 = fVar94 * fVar103 + fVar114;
      fVar145 = fVar94 * fVar117 + fVar114;
      fVar114 = fVar94 * fVar119 + fVar114;
      fVar118 = fVar98 * fVar99 + fVar115;
      fVar120 = fVar98 * fVar103 + fVar115;
      fVar122 = fVar98 * fVar117 + fVar115;
      fVar115 = fVar98 * fVar119 + fVar115;
      fVar125 = fVar102 * fVar99 + fVar116;
      fVar128 = fVar102 * fVar103 + fVar116;
      fVar131 = fVar102 * fVar117 + fVar116;
      fVar116 = fVar102 * fVar119 + fVar116;
      fVar94 = *(float *)(lVar23 + -0x70 + uVar26 * 4);
      fVar98 = *(float *)(lVar23 + -0x60 + uVar26 * 4);
      fVar102 = *(float *)(lVar23 + -0x50 + uVar26 * 4);
      fVar30 = *(float *)(lVar23 + -0xf0 + uVar26 * 4);
      fVar42 = *(float *)(lVar23 + -0xe0 + uVar26 * 4);
      fVar44 = *(float *)(lVar23 + -0x40 + uVar26 * 4);
      fVar46 = *(float *)(lVar23 + -0x30 + uVar26 * 4);
      fVar73 = *(float *)(lVar23 + -0x20 + uVar26 * 4);
      fVar78 = *(float *)(lVar23 + -0xd0 + uVar26 * 4);
      fVar81 = *(float *)(lVar23 + -0xc0 + uVar26 * 4);
      fVar84 = *(float *)(lVar23 + -0xb0 + uVar26 * 4);
      fVar72 = fVar143 - (fVar94 * fVar99 + fVar106);
      fVar77 = fVar144 - (fVar94 * fVar103 + fVar106);
      fVar80 = fVar145 - (fVar94 * fVar117 + fVar106);
      fVar83 = fVar114 - (fVar94 * fVar119 + fVar106);
      fVar150 = fVar118 - (fVar98 * fVar99 + fVar30);
      fVar151 = fVar120 - (fVar98 * fVar103 + fVar30);
      fVar152 = fVar122 - (fVar98 * fVar117 + fVar30);
      fVar153 = fVar115 - (fVar98 * fVar119 + fVar30);
      fVar96 = fVar125 - (fVar102 * fVar99 + fVar42);
      fVar100 = fVar128 - (fVar102 * fVar103 + fVar42);
      fVar104 = fVar131 - (fVar102 * fVar117 + fVar42);
      fVar108 = fVar116 - (fVar102 * fVar119 + fVar42);
      fVar86 = (fVar44 * fVar99 + fVar78) - fVar143;
      fVar89 = (fVar44 * fVar103 + fVar78) - fVar144;
      fVar91 = (fVar44 * fVar117 + fVar78) - fVar145;
      fVar93 = (fVar44 * fVar119 + fVar78) - fVar114;
      fVar146 = (fVar46 * fVar99 + fVar81) - fVar118;
      fVar147 = (fVar46 * fVar103 + fVar81) - fVar120;
      fVar148 = (fVar46 * fVar117 + fVar81) - fVar122;
      fVar149 = (fVar46 * fVar119 + fVar81) - fVar115;
      fVar154 = (fVar73 * fVar99 + fVar84) - fVar125;
      fVar155 = (fVar73 * fVar103 + fVar84) - fVar128;
      fVar156 = (fVar73 * fVar117 + fVar84) - fVar131;
      fVar157 = (fVar73 * fVar119 + fVar84) - fVar116;
      fVar30 = fVar96 * fVar146 - fVar150 * fVar154;
      fVar42 = fVar100 * fVar147 - fVar151 * fVar155;
      fVar44 = fVar104 * fVar148 - fVar152 * fVar156;
      fVar46 = fVar108 * fVar149 - fVar153 * fVar157;
      fVar97 = fVar72 * fVar154 - fVar96 * fVar86;
      fVar101 = fVar77 * fVar155 - fVar100 * fVar89;
      fVar105 = fVar80 * fVar156 - fVar104 * fVar91;
      fVar109 = fVar83 * fVar157 - fVar108 * fVar93;
      fVar94 = fVar150 * fVar86 - fVar72 * fVar146;
      fVar98 = fVar151 * fVar89 - fVar77 * fVar147;
      fVar102 = fVar152 * fVar91 - fVar80 * fVar148;
      fVar106 = fVar153 * fVar93 - fVar83 * fVar149;
      fVar143 = fVar143 - *(float *)ray;
      fVar144 = fVar144 - *(float *)(ray + 4);
      fVar145 = fVar145 - *(float *)(ray + 8);
      fVar114 = fVar114 - *(float *)(ray + 0xc);
      fVar118 = fVar118 - *(float *)(ray + 0x10);
      fVar120 = fVar120 - *(float *)(ray + 0x14);
      fVar122 = fVar122 - *(float *)(ray + 0x18);
      fVar115 = fVar115 - *(float *)(ray + 0x1c);
      fVar125 = fVar125 - *(float *)(ray + 0x20);
      fVar128 = fVar128 - *(float *)(ray + 0x24);
      fVar131 = fVar131 - *(float *)(ray + 0x28);
      fVar116 = fVar116 - *(float *)(ray + 0x2c);
      fVar99 = fVar118 * fVar76 - fVar125 * fVar135;
      fVar103 = fVar120 * fVar79 - fVar128 * fVar29;
      fVar117 = fVar122 * fVar88 - fVar131 * fVar41;
      fVar119 = fVar115 * fVar90 - fVar116 * fVar43;
      fVar73 = *(float *)(ray + 0x40);
      fVar78 = *(float *)(ray + 0x44);
      fVar81 = *(float *)(ray + 0x48);
      fVar84 = *(float *)(ray + 0x4c);
      fVar121 = fVar125 * fVar73 - fVar143 * fVar76;
      fVar123 = fVar128 * fVar78 - fVar144 * fVar79;
      fVar60 = fVar131 * fVar81 - fVar145 * fVar88;
      fVar62 = fVar116 * fVar84 - fVar114 * fVar90;
      fVar64 = fVar143 * fVar135 - fVar118 * fVar73;
      fVar68 = fVar144 * fVar29 - fVar120 * fVar78;
      fVar69 = fVar145 * fVar41 - fVar122 * fVar81;
      fVar70 = fVar114 * fVar43 - fVar115 * fVar84;
      fVar135 = fVar73 * fVar30 + fVar135 * fVar97 + fVar76 * fVar94;
      fVar29 = fVar78 * fVar42 + fVar29 * fVar101 + fVar79 * fVar98;
      fVar41 = fVar81 * fVar44 + fVar41 * fVar105 + fVar88 * fVar102;
      fVar43 = fVar84 * fVar46 + fVar43 * fVar109 + fVar90 * fVar106;
      uVar124 = (uint)fVar135 & 0x80000000;
      uVar127 = (uint)fVar29 & 0x80000000;
      uVar130 = (uint)fVar41 & 0x80000000;
      uVar133 = (uint)fVar43 & 0x80000000;
      fVar73 = (float)((uint)(fVar86 * fVar99 + fVar146 * fVar121 + fVar154 * fVar64) ^ uVar124);
      fVar78 = (float)((uint)(fVar89 * fVar103 + fVar147 * fVar123 + fVar155 * fVar68) ^ uVar127);
      fVar81 = (float)((uint)(fVar91 * fVar117 + fVar148 * fVar60 + fVar156 * fVar69) ^ uVar130);
      fVar84 = (float)((uint)(fVar93 * fVar119 + fVar149 * fVar62 + fVar157 * fVar70) ^ uVar133);
      uVar134 = -(uint)(0.0 <= fVar73) & auVar65._0_4_;
      uVar136 = -(uint)(0.0 <= fVar78) & auVar65._4_4_;
      uVar137 = -(uint)(0.0 <= fVar81) & auVar65._8_4_;
      uVar138 = -(uint)(0.0 <= fVar84) & auVar65._12_4_;
      auVar10._4_4_ = uVar136;
      auVar10._0_4_ = uVar134;
      auVar10._8_4_ = uVar137;
      auVar10._12_4_ = uVar138;
      iVar15 = movmskps((int)pRVar22,auVar10);
      local_1908 = (uint)uVar11;
      uStack_1904 = SUB84(uVar11,4);
      uStack_1900 = (uint)uVar12;
      uStack_18fc = SUB84(uVar12,4);
      auVar113 = auVar47;
      uVar21 = local_1908;
      uVar126 = uStack_1904;
      uVar129 = uStack_1900;
      uVar132 = uStack_18fc;
      if (iVar15 == 0) {
        aVar75.i[1] = (int)fVar85;
        aVar75.i[0] = (int)fVar110;
        aVar75.i[2] = (int)fVar92;
        aVar75.i[3] = (int)fVar95;
        uStack_1990 = uStack_1960;
        local_1998 = (undefined1  [8])local_1968;
        fVar30 = fVar54;
        fVar42 = fVar59;
        fVar44 = fVar61;
        fVar46 = fVar63;
        fVar94 = fVar45;
        fVar98 = fVar71;
        fVar102 = fVar107;
        fVar106 = fVar82;
        fVar73 = local_1958;
        fVar78 = fStack_1954;
        fVar81 = fStack_1950;
        fVar84 = fStack_194c;
        fVar99 = fStack_1980;
        fVar114 = fStack_197c;
        fVar103 = local_1988;
        fVar117 = fStack_1984;
      }
      else {
        auVar113._4_4_ = fVar101;
        auVar113._0_4_ = fVar97;
        fVar76 = (float)((uint)(fVar72 * fVar99 + fVar150 * fVar121 + fVar96 * fVar64) ^ uVar124);
        fVar79 = (float)((uint)(fVar77 * fVar103 + fVar151 * fVar123 + fVar100 * fVar68) ^ uVar127);
        fVar88 = (float)((uint)(fVar80 * fVar117 + fVar152 * fVar60 + fVar104 * fVar69) ^ uVar130);
        fVar90 = (float)((uint)(fVar83 * fVar119 + fVar153 * fVar62 + fVar108 * fVar70) ^ uVar133);
        auVar52._0_4_ = -(uint)(0.0 <= fVar76) & uVar134;
        auVar52._4_4_ = -(uint)(0.0 <= fVar79) & uVar136;
        auVar52._8_4_ = -(uint)(0.0 <= fVar88) & uVar137;
        auVar52._12_4_ = -(uint)(0.0 <= fVar90) & uVar138;
        iVar15 = movmskps(iVar15,auVar52);
        if (iVar15 != 0) {
          local_1998._0_4_ = ABS(fVar135);
          local_1998._4_4_ = ABS(fVar29);
          uStack_1990._0_4_ = ABS(fVar41);
          uStack_1990._4_4_ = ABS(fVar43);
          auVar39._0_4_ = -(uint)(fVar76 <= (float)local_1998._0_4_ - fVar73) & auVar52._0_4_;
          auVar39._4_4_ = -(uint)(fVar79 <= (float)local_1998._4_4_ - fVar78) & auVar52._4_4_;
          auVar39._8_4_ = -(uint)(fVar88 <= (float)uStack_1990 - fVar81) & auVar52._8_4_;
          auVar39._12_4_ = -(uint)(fVar90 <= uStack_1990._4_4_ - fVar84) & auVar52._12_4_;
          iVar15 = movmskps(iVar15,auVar39);
          if (iVar15 != 0) {
            fVar103 = (float)(uVar124 ^
                             (uint)(fVar143 * fVar30 + fVar118 * fVar97 + fVar125 * fVar94));
            fVar117 = (float)(uVar127 ^
                             (uint)(fVar144 * fVar42 + fVar120 * fVar101 + fVar128 * fVar98));
            fVar99 = (float)(uVar130 ^
                            (uint)(fVar145 * fVar44 + fVar122 * fVar105 + fVar131 * fVar102));
            fVar114 = (float)(uVar133 ^
                             (uint)(fVar114 * fVar46 + fVar115 * fVar109 + fVar116 * fVar106));
            auVar53._0_4_ =
                 -(uint)(fVar103 <= *(float *)(ray + 0x80) * (float)local_1998._0_4_ &&
                        *(float *)(ray + 0x30) * (float)local_1998._0_4_ < fVar103) & auVar39._0_4_;
            auVar53._4_4_ =
                 -(uint)(fVar117 <= *(float *)(ray + 0x84) * (float)local_1998._4_4_ &&
                        *(float *)(ray + 0x34) * (float)local_1998._4_4_ < fVar117) & auVar39._4_4_;
            auVar53._8_4_ =
                 -(uint)(fVar99 <= *(float *)(ray + 0x88) * (float)uStack_1990 &&
                        *(float *)(ray + 0x38) * (float)uStack_1990 < fVar99) & auVar39._8_4_;
            auVar53._12_4_ =
                 -(uint)(fVar114 <= *(float *)(ray + 0x8c) * uStack_1990._4_4_ &&
                        *(float *)(ray + 0x3c) * uStack_1990._4_4_ < fVar114) & auVar39._12_4_;
            iVar15 = movmskps(iVar15,auVar53);
            if (iVar15 != 0) {
              aVar75.v[1] = fVar79;
              aVar75.v[0] = fVar76;
              aVar75.v[2] = fVar88;
              aVar75.v[3] = fVar90;
              uVar21 = -(uint)(fVar135 != 0.0) & auVar53._0_4_;
              uVar126 = -(uint)(fVar29 != 0.0) & auVar53._4_4_;
              uVar129 = -(uint)(fVar41 != 0.0) & auVar53._8_4_;
              uVar132 = -(uint)(fVar43 != 0.0) & auVar53._12_4_;
              auVar9._4_4_ = uVar126;
              auVar9._0_4_ = uVar21;
              auVar9._8_4_ = uVar129;
              auVar9._12_4_ = uVar132;
              iVar15 = movmskps(iVar15,auVar9);
              auVar113._8_4_ = fVar105;
              auVar113._12_4_ = fVar109;
              if (iVar15 == 0) {
                aVar75.i[1] = (int)fVar85;
                aVar75.i[0] = (int)fVar110;
                aVar75.i[2] = (int)fVar92;
                aVar75.i[3] = (int)fVar95;
                uStack_1990 = uStack_1960;
                local_1998 = (undefined1  [8])local_1968;
                fVar30 = fVar54;
                fVar42 = fVar59;
                fVar44 = fVar61;
                fVar46 = fVar63;
                auVar113 = auVar47;
                fVar94 = fVar45;
                fVar98 = fVar71;
                fVar102 = fVar107;
                fVar106 = fVar82;
                uVar21 = local_1908;
                uVar126 = uStack_1904;
                uVar129 = uStack_1900;
                uVar132 = uStack_18fc;
                fVar73 = local_1958;
                fVar78 = fStack_1954;
                fVar81 = fStack_1950;
                fVar84 = fStack_194c;
                fVar99 = fStack_1980;
                fVar114 = fStack_197c;
                fVar103 = local_1988;
                fVar117 = fStack_1984;
              }
              goto LAB_00db9887;
            }
          }
        }
        aVar75.i[1] = (int)fVar85;
        aVar75.i[0] = (int)fVar110;
        aVar75.i[2] = (int)fVar92;
        aVar75.i[3] = (int)fVar95;
        uStack_1990 = uStack_1960;
        local_1998 = (undefined1  [8])local_1968;
        fVar30 = fVar54;
        fVar42 = fVar59;
        fVar44 = fVar61;
        fVar46 = fVar63;
        fVar94 = fVar45;
        fVar98 = fVar71;
        fVar102 = fVar107;
        fVar106 = fVar82;
        fVar73 = local_1958;
        fVar78 = fStack_1954;
        fVar81 = fStack_1950;
        fVar84 = fStack_194c;
        fVar99 = fStack_1980;
        fVar114 = fStack_197c;
        fVar103 = local_1988;
        fVar117 = fStack_1984;
      }
LAB_00db9887:
      fStack_1984 = fVar117;
      local_1988 = fVar103;
      fStack_197c = fVar114;
      fStack_1980 = fVar99;
      fStack_194c = fVar84;
      fStack_1950 = fVar81;
      fStack_1954 = fVar78;
      local_1958 = fVar73;
      auVar47 = auVar113;
      pRVar2 = (context->scene->geometries).items;
      pGVar3 = pRVar2[uVar14].ptr;
      uVar134 = pGVar3->mask;
      auVar49._0_4_ = -(uint)((uVar134 & *(uint *)(ray + 0x90)) == 0);
      auVar49._4_4_ = -(uint)((uVar134 & *(uint *)(ray + 0x94)) == 0);
      auVar49._8_4_ = -(uint)((uVar134 & *(uint *)(ray + 0x98)) == 0);
      auVar49._12_4_ = -(uint)((uVar134 & *(uint *)(ray + 0x9c)) == 0);
      auVar8._4_4_ = uVar126;
      auVar8._0_4_ = uVar21;
      auVar8._8_4_ = uVar129;
      auVar8._12_4_ = uVar132;
      auVar50 = ~auVar49 & auVar8;
      uVar21 = movmskps((int)pRVar2,auVar50);
      pRVar22 = (RTCIntersectArguments *)(ulong)uVar21;
      fVar110 = aVar75.v[0];
      fVar85 = aVar75.v[1];
      fVar92 = aVar75.v[2];
      fVar95 = aVar75.v[3];
      if (uVar21 != 0) {
        uVar21 = *(uint *)(lVar23 + uVar26 * 4);
        pRVar22 = (RTCIntersectArguments *)(ulong)uVar21;
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar32 = rcpps(ZEXT416(uVar134),_local_1998);
          fVar54 = auVar32._0_4_;
          fVar59 = auVar32._4_4_;
          fVar61 = auVar32._8_4_;
          fVar63 = auVar32._12_4_;
          fVar54 = (1.0 - (float)local_1998._0_4_ * fVar54) * fVar54 + fVar54;
          fVar59 = (1.0 - (float)local_1998._4_4_ * fVar59) * fVar59 + fVar59;
          fVar61 = (1.0 - (float)uStack_1990 * fVar61) * fVar61 + fVar61;
          fVar63 = (1.0 - uStack_1990._4_4_ * fVar63) * fVar63 + fVar63;
          local_1738 = local_1958 * fVar54;
          fStack_1734 = fStack_1954 * fVar59;
          fStack_1730 = fStack_1950 * fVar61;
          fStack_172c = fStack_194c * fVar63;
          local_1728 = fVar110 * fVar54;
          fStack_1724 = fVar85 * fVar59;
          fStack_1720 = fVar92 * fVar61;
          fStack_171c = fVar95 * fVar63;
          local_1718._4_4_ = uVar21;
          local_1718._0_4_ = uVar21;
          local_1718._8_4_ = uVar21;
          local_1718._12_4_ = uVar21;
          auVar56._0_4_ = fVar54 * local_1988;
          auVar56._4_4_ = fVar59 * fStack_1984;
          auVar56._8_4_ = fVar61 * fStack_1980;
          auVar56._12_4_ = fVar63 * fStack_197c;
          local_16f8 = context->user->instID[0];
          local_16e8 = context->user->instPrimID[0];
          auVar32 = *(undefined1 (*) [16])(ray + 0x80);
          auVar67 = blendvps(auVar32,auVar56,auVar50);
          *(undefined1 (*) [16])(ray + 0x80) = auVar67;
          args.valid = (int *)local_18b8;
          args.geometryUserPtr = pGVar3->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          pRVar18 = (RTCRayN *)pGVar3->occlusionFilterN;
          local_18b8 = auVar50;
          args.ray = (RTCRayN *)ray;
          local_1768 = fVar30;
          fStack_1764 = fVar42;
          fStack_1760 = fVar44;
          fStack_175c = fVar46;
          local_1758 = auVar47;
          local_1748 = fVar94;
          fStack_1744 = fVar98;
          fStack_1740 = fVar102;
          fStack_173c = fVar106;
          local_1708 = uVar14;
          uStack_1704 = uVar14;
          uStack_1700 = uVar14;
          uStack_16fc = uVar14;
          uStack_16f4 = local_16f8;
          uStack_16f0 = local_16f8;
          uStack_16ec = local_16f8;
          uStack_16e4 = local_16e8;
          uStack_16e0 = local_16e8;
          uStack_16dc = local_16e8;
          if (pRVar18 != (RTCRayN *)0x0) {
            pRVar18 = (RTCRayN *)(*(code *)pRVar18)(&args);
          }
          if (local_18b8 == (undefined1  [16])0x0) {
            auVar57._8_4_ = 0xffffffff;
            auVar57._0_8_ = 0xffffffffffffffff;
            auVar57._12_4_ = 0xffffffff;
            auVar57 = auVar57 ^ _DAT_01f7ae20;
          }
          else {
            pRVar22 = context->args;
            if ((pRVar22->filter != (RTCFilterFunctionN)0x0) &&
               (((pRVar22->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*pRVar22->filter)(&args);
            }
            auVar51._0_4_ = -(uint)(local_18b8._0_4_ == 0);
            auVar51._4_4_ = -(uint)(local_18b8._4_4_ == 0);
            auVar51._8_4_ = -(uint)(local_18b8._8_4_ == 0);
            auVar51._12_4_ = -(uint)(local_18b8._12_4_ == 0);
            auVar57 = auVar51 ^ _DAT_01f7ae20;
            auVar67 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar51);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar67;
            pRVar18 = args.ray;
          }
          uVar14 = (uint)pRVar18;
          auVar58._0_4_ = auVar57._0_4_ << 0x1f;
          auVar58._4_4_ = auVar57._4_4_ << 0x1f;
          auVar58._8_4_ = auVar57._8_4_ << 0x1f;
          auVar58._12_4_ = auVar57._12_4_ << 0x1f;
          auVar50._0_4_ = auVar58._0_4_ >> 0x1f;
          auVar50._4_4_ = auVar58._4_4_ >> 0x1f;
          auVar50._8_4_ = auVar58._8_4_ >> 0x1f;
          auVar50._12_4_ = auVar58._12_4_ >> 0x1f;
          auVar32 = blendvps(auVar32,*(undefined1 (*) [16])(ray + 0x80),auVar58);
          *(undefined1 (*) [16])(ray + 0x80) = auVar32;
        }
        auVar65 = ~auVar50 & auVar65;
      }
      uVar14 = movmskps(uVar14,auVar65);
      uVar17 = (ulong)uVar14;
      if ((uVar14 == 0) ||
         (uVar17 = uVar26 + 1, bVar28 = 2 < uVar26, uVar26 = uVar17, fVar54 = fVar30,
         fVar59 = fVar42, fVar61 = fVar44, fVar63 = fVar46, fVar45 = fVar94, fVar71 = fVar98,
         fVar107 = fVar102, fVar82 = fVar106, bVar28)) goto LAB_00db9e53;
    }
    aVar75.i[1] = (int)fVar85;
    aVar75.i[0] = (int)fVar110;
    aVar75.i[2] = (int)fVar92;
    aVar75.i[3] = (int)fVar95;
    uVar17 = 0xffffffff;
    fVar30 = fVar54;
    fVar42 = fVar59;
    fVar44 = fVar61;
    fVar46 = fVar63;
    fVar94 = fVar45;
    fVar98 = fVar71;
    fVar102 = fVar107;
    fVar106 = fVar82;
LAB_00db9e53:
    local_1778 = auVar48._0_4_;
    uStack_1774 = auVar48._4_4_;
    uStack_1770 = auVar48._8_4_;
    uStack_176c = auVar48._12_4_;
    auVar48._0_4_ = local_1778 & auVar65._0_4_;
    auVar48._4_4_ = uStack_1774 & auVar65._4_4_;
    auVar48._8_4_ = uStack_1770 & auVar65._8_4_;
    auVar48._12_4_ = uStack_176c & auVar65._12_4_;
    iVar15 = movmskps((int)uVar17,auVar48);
    if (iVar15 == 0) break;
  }
  uVar16 = CONCAT44(auVar48._4_4_,auVar48._0_4_);
  terminated.field_0._0_8_ = uVar16 ^ 0xffffffffffffffff;
  terminated.field_0.i[2] = auVar48._8_4_ ^ 0xffffffff;
  terminated.field_0.i[3] = auVar48._12_4_ ^ 0xffffffff;
LAB_00db9e9f:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])vVar13.field_0 | (undefined1  [16])terminated.field_0);
  uVar14 = movmskps(iVar15,(undefined1  [16])terminated.field_0);
  if (uVar14 == 0xf) goto LAB_00db9ed0;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                (undefined1  [16])terminated.field_0);
  goto LAB_00db90ff;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }